

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O0

void __thiscall vkb::DeviceBuilder::DeviceBuilder(DeviceBuilder *this,PhysicalDevice *phys_device)

{
  PhysicalDevice *phys_device_local;
  DeviceBuilder *this_local;
  
  PhysicalDevice::PhysicalDevice(&this->physical_device);
  DeviceInfo::DeviceInfo(&this->info);
  PhysicalDevice::operator=(&this->physical_device,phys_device);
  return;
}

Assistant:

DeviceBuilder::DeviceBuilder(PhysicalDevice phys_device) { physical_device = std::move(phys_device); }